

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir_Resampler.cpp
# Opt level: O1

blargg_err_t __thiscall Fir_Resampler_::buffer_size(Fir_Resampler_ *this,int new_size)

{
  short *psVar1;
  size_t sVar2;
  char *pcVar3;
  
  sVar2 = (long)new_size + (long)this->write_offset;
  psVar1 = (short *)realloc((this->buf).begin_,sVar2 * 2);
  if ((int)sVar2 == 0 || psVar1 != (short *)0x0) {
    (this->buf).begin_ = psVar1;
    (this->buf).size_ = sVar2;
    this->imp_phase = 0;
    if ((this->buf).size_ == 0) {
      pcVar3 = (blargg_err_t)0x0;
    }
    else {
      psVar1 = (this->buf).begin_;
      this->write_pos = psVar1 + this->write_offset;
      pcVar3 = (blargg_err_t)0x0;
      memset(psVar1,0,(long)this->write_offset * 2);
    }
  }
  else {
    pcVar3 = "Out of memory";
  }
  return pcVar3;
}

Assistant:

blargg_err_t Fir_Resampler_::buffer_size( int new_size )
{
	RETURN_ERR( buf.resize( new_size + write_offset ) );
	clear();
	return 0;
}